

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initialize.c
# Opt level: O1

void mesh_Initialize(Node_status *node_status,double *space_coordinate,Grid *grid)

{
  uint uVar1;
  ulong uVar2;
  
  *node_status = LEFT;
  node_status[grid->X_nodes - 1] = RIGHT;
  uVar1 = grid->X_nodes;
  if (uVar1 - 3 < 0xfffffffe) {
    uVar2 = 1;
    do {
      node_status[uVar2] = MIDDLE;
      uVar2 = uVar2 + 1;
      uVar1 = grid->X_nodes;
    } while (uVar2 < uVar1 - 1);
  }
  if (uVar1 != 0) {
    uVar2 = 0;
    do {
      space_coordinate[uVar2] = (double)(uVar2 & 0xffffffff) * grid->X_step;
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  return;
}

Assistant:

void mesh_Initialize (Node_status * node_status, double * space_coordinate, Grid * grid) {
  unsigned space_step;
  node_status[0] = LEFT;
  node_status[grid->X_nodes - 1] = RIGHT;
  for (space_step = 1; space_step < grid->X_nodes - 1; ++space_step) {
    node_status[space_step] = MIDDLE;
  }

  for (space_step = 0; space_step < grid->X_nodes; ++space_step) {
    space_coordinate[space_step] = space_step * grid->X_step;
  }

  return;
}